

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O0

WebPChunk ** MuxGetChunkListFromId(WebPMux *mux,WebPChunkId id)

{
  WebPChunkId id_local;
  WebPMux *mux_local;
  WebPChunk **local_8;
  
  switch(id) {
  case WEBP_CHUNK_VP8X:
    local_8 = &mux->vp8x;
    break;
  case WEBP_CHUNK_ICCP:
    local_8 = &mux->iccp;
    break;
  case WEBP_CHUNK_ANIM:
    local_8 = &mux->anim;
    break;
  default:
    local_8 = &mux->unknown;
    break;
  case WEBP_CHUNK_EXIF:
    local_8 = &mux->exif;
    break;
  case WEBP_CHUNK_XMP:
    local_8 = &mux->xmp;
  }
  return local_8;
}

Assistant:

WebPChunk** MuxGetChunkListFromId(const WebPMux* mux, WebPChunkId id) {
  assert(mux != NULL);
  switch (id) {
    case WEBP_CHUNK_VP8X:    return (WebPChunk**)&mux->vp8x;
    case WEBP_CHUNK_ICCP:    return (WebPChunk**)&mux->iccp;
    case WEBP_CHUNK_ANIM:    return (WebPChunk**)&mux->anim;
    case WEBP_CHUNK_EXIF:    return (WebPChunk**)&mux->exif;
    case WEBP_CHUNK_XMP:     return (WebPChunk**)&mux->xmp;
    default:                 return (WebPChunk**)&mux->unknown;
  }
}